

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseScaleOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  LocalPointer<icu_63::number::impl::DecNum> arbitraryToAdopt;
  int32_t textLength;
  UErrorCode UVar1;
  UnicodeString *s;
  StringPiece str;
  UErrorCode conversionStatus;
  ConstChar16Ptr local_f8;
  char16_t *local_f0;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  StackBufferOrFields local_d8;
  UnicodeString local_a0;
  CharString buffer;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&buffer.buffer);
  buffer.len = 0;
  *buffer.buffer.ptr = '\0';
  conversionStatus = U_ZERO_ERROR;
  numparse::impl::StringSegment::toTempUnicodeString((UnicodeString *)&decnum,segment);
  if ((local_d8.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_d8.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_d8.fFields.fArray = local_d8.fStackFields.fBuffer;
    }
  }
  else {
    local_d8.fFields.fArray = (char16_t *)0x0;
  }
  local_f8.p_ = local_d8.fFields.fArray;
  textLength = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString(&local_a0,'\0',&local_f8,textLength);
  s = &local_a0;
  CharString::appendInvariantChars(&buffer,s,&conversionStatus);
  UnicodeString::~UnicodeString(&local_a0);
  local_f0 = local_f8.p_;
  UnicodeString::~UnicodeString((UnicodeString *)&decnum);
  UVar1 = U_NUMBER_SKELETON_SYNTAX_ERROR;
  if ((conversionStatus == U_INVARIANT_CONVERSION_ERROR) ||
     (UVar1 = conversionStatus, U_ZERO_ERROR < conversionStatus)) {
    *status = UVar1;
  }
  else {
    decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
         (LocalPointerBase<icu_63::number::impl::DecNum>)
         UMemory::operator_new((UMemory *)0x60,(size_t)s);
    if (decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr != (DecNum *)0x0) {
      DecNum::DecNum((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR &&
        decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr == (DecNum *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      str.length_ = buffer.len;
      str.ptr_ = buffer.buffer.ptr;
      str._12_4_ = 0;
      DecNum::setTo((DecNum *)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr,str,
                    status);
      arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
           decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr =
             (LocalPointerBase<icu_63::number::impl::DecNum>)(DecNum *)0x0;
        Scale::Scale((Scale *)&local_a0,0,
                     (DecNum *)
                     arbitraryToAdopt.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
        Scale::operator=(&macros->scale,(Scale *)&local_a0);
        Scale::~Scale((Scale *)&local_a0);
      }
      else {
        *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
      }
    }
    LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer(&decnum);
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&buffer.buffer);
  return;
}

Assistant:

void blueprint_helpers::parseScaleOption(const StringSegment& segment, MacroProps& macros,
                                              UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    LocalPointer<DecNum> decnum(new DecNum(), status);
    if (U_FAILURE(status)) { return; }
    decnum->setTo({buffer.data(), buffer.length()}, status);
    if (U_FAILURE(status)) {
        // This is a skeleton syntax error; don't let the low-level decnum error bubble up
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // NOTE: The constructor will optimize the decnum for us if possible.
    macros.scale = {0, decnum.orphan()};
}